

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

void __thiscall
LLVMBC::CmpInst::CmpInst(CmpInst *this,ValueKind kind,Predicate pred_,Value *LHS,Value *RHS)

{
  initializer_list<LLVMBC::Value_*> __l;
  Type *pTVar1;
  LLVMContext *context;
  allocator_type local_61;
  Value *local_60;
  Value *local_58;
  iterator local_50;
  undefined8 local_48;
  vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_> local_40;
  Value *local_28;
  Value *RHS_local;
  Value *LHS_local;
  Predicate pred__local;
  ValueKind kind_local;
  CmpInst *this_local;
  
  local_28 = RHS;
  RHS_local = LHS;
  LHS_local._0_4_ = pred_;
  LHS_local._4_4_ = kind;
  _pred__local = this;
  pTVar1 = Value::getType(LHS);
  context = Type::getContext(pTVar1);
  pTVar1 = Type::getInt1Ty(context);
  Instruction::Instruction(&this->super_Instruction,pTVar1,LHS_local._4_4_);
  this->pred = (Predicate)LHS_local;
  local_60 = RHS_local;
  local_58 = local_28;
  local_50 = &local_60;
  local_48 = 2;
  __l._M_len = 2;
  __l._M_array = local_50;
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::vector
            (&local_40,__l,&local_61);
  Instruction::set_operands(&this->super_Instruction,&local_40);
  std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::~vector(&local_40)
  ;
  return;
}

Assistant:

CmpInst::CmpInst(ValueKind kind, Predicate pred_, Value *LHS, Value *RHS)
    : Instruction(Type::getInt1Ty(LHS->getType()->getContext()), kind)
    , pred(pred_)
{
	set_operands({ LHS, RHS });
}